

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fasttext.cc
# Opt level: O2

shared_ptr<const_fasttext::DenseMatrix> __thiscall
fasttext::FastText::getInputMatrix(FastText *this)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var1;
  runtime_error *this_00;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  long in_RSI;
  shared_ptr<const_fasttext::DenseMatrix> sVar2;
  shared_ptr<fasttext::Matrix> local_28;
  
  if (*(char *)(in_RSI + 0x68) == '\x01') {
    this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(this_00,"Can\'t export quantized matrix");
    __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  if (*(long *)(in_RSI + 0x20) != 0) {
    std::dynamic_pointer_cast<fasttext::DenseMatrix,fasttext::Matrix>(&local_28);
    _Var1._M_pi = local_28.super___shared_ptr<fasttext::Matrix,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount._M_pi;
    local_28.super___shared_ptr<fasttext::Matrix,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    (this->args_).super___shared_ptr<fasttext::Args,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)
         local_28.super___shared_ptr<fasttext::Matrix,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    (this->args_).super___shared_ptr<fasttext::Args,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         _Var1._M_pi;
    local_28.super___shared_ptr<fasttext::Matrix,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)0x0;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&local_28.super___shared_ptr<fasttext::Matrix,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount);
    sVar2.super___shared_ptr<const_fasttext::DenseMatrix,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
    _M_pi = extraout_RDX._M_pi;
    sVar2.super___shared_ptr<const_fasttext::DenseMatrix,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)this;
    return (shared_ptr<const_fasttext::DenseMatrix>)
           sVar2.super___shared_ptr<const_fasttext::DenseMatrix,_(__gnu_cxx::_Lock_policy)2>;
  }
  __assert_fail("input_.get()",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/asd5510[P]fastText-chinese-word2vec-optimization/src/fasttext.cc"
                ,0x45,
                "std::shared_ptr<const DenseMatrix> fasttext::FastText::getInputMatrix() const");
}

Assistant:

std::shared_ptr<const DenseMatrix> FastText::getInputMatrix() const {
  if (quant_) {
    throw std::runtime_error("Can't export quantized matrix");
  }
  assert(input_.get());
  return std::dynamic_pointer_cast<DenseMatrix>(input_);
}